

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

void estimate_coeff(FIRSTPASS_STATS *first_stats,FIRSTPASS_STATS *last_stats)

{
  ulong in_RSI;
  long in_RDI;
  double dVar1;
  double dVar2;
  double cor_coeff;
  double C;
  FIRSTPASS_STATS *this_stats;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_50;
  undefined8 local_40;
  undefined8 local_30;
  undefined8 local_18;
  
  for (local_18 = in_RDI + 0xe8; local_18 < in_RSI; local_18 = local_18 + 0xe8) {
    if (*(double *)(local_18 - 0xd8) * (*(double *)(local_18 + 0x10) - *(double *)(local_18 + 0x20))
        <= 0.001) {
      local_30 = 0.001;
    }
    else {
      local_30 = *(double *)(local_18 - 0xd8) *
                 (*(double *)(local_18 + 0x10) - *(double *)(local_18 + 0x20));
    }
    dVar1 = sqrt(local_30);
    if (*(double *)(local_18 - 0xd8) - *(double *)(local_18 + 200) <= 0.001) {
      local_40 = 0.001;
    }
    else {
      local_40 = *(double *)(local_18 - 0xd8) - *(double *)(local_18 + 200);
    }
    if (*(double *)(local_18 - 0xd8) - *(double *)(local_18 + 200) <= 0.001) {
      local_50 = 0.001;
    }
    else {
      local_50 = *(double *)(local_18 - 0xd8) - *(double *)(local_18 + 200);
    }
    if (*(double *)(local_18 + 0x10) - *(double *)(local_18 + 200) <= 0.001) {
      local_60 = 0.001;
    }
    else {
      local_60 = *(double *)(local_18 + 0x10) - *(double *)(local_18 + 200);
    }
    dVar2 = sqrt(local_50 / local_60);
    *(double *)(local_18 + 0xd0) = (dVar1 / local_40) * dVar2;
    if (*(double *)(local_18 + 0xd0) <= 0.0) {
      local_68 = 0.0;
    }
    else {
      local_68 = *(double *)(local_18 + 0xd0);
    }
    if (1.0 <= local_68) {
      local_78 = 0x3ff0000000000000;
    }
    else {
      if (*(double *)(local_18 + 0xd0) <= 0.0) {
        local_70 = 0;
      }
      else {
        local_70 = *(undefined8 *)(local_18 + 0xd0);
      }
      local_78 = local_70;
    }
    *(undefined8 *)(local_18 + 0xd0) = local_78;
  }
  *(undefined8 *)(in_RDI + 0xd0) = 0x3ff0000000000000;
  return;
}

Assistant:

static void estimate_coeff(FIRSTPASS_STATS *first_stats,
                           FIRSTPASS_STATS *last_stats) {
  FIRSTPASS_STATS *this_stats;
  for (this_stats = first_stats + 1; this_stats < last_stats; this_stats++) {
    const double C =
        sqrt(AOMMAX((this_stats - 1)->intra_error *
                        (this_stats->intra_error - this_stats->coded_error),
                    0.001));
    const double cor_coeff =
        C /
        AOMMAX((this_stats - 1)->intra_error - this_stats->noise_var, 0.001);

    this_stats->cor_coeff =
        cor_coeff *
        sqrt(AOMMAX((this_stats - 1)->intra_error - this_stats->noise_var,
                    0.001) /
             AOMMAX(this_stats->intra_error - this_stats->noise_var, 0.001));
    // clip correlation coefficient.
    this_stats->cor_coeff = AOMMIN(AOMMAX(this_stats->cor_coeff, 0), 1);
  }
  first_stats->cor_coeff = 1.0;
}